

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable.cpp
# Opt level: O2

void __thiscall Variable::Variable(Variable *this,Kind kind,string *type,int value,int tag)

{
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->arraySize).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->arraySize).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->arraySize).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->kind = kind;
  std::__cxx11::to_string(&local_70,tag);
  std::operator+(&local_50,"literal_",&local_70);
  std::__cxx11::string::operator=((string *)&this->name,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  this->visibility = PRIVATE;
  std::__cxx11::string::operator=((string *)&this->type,(string *)type);
  this->value = value;
  this->dimensions = 0;
  this->size = 0;
  this->offset = 0;
  return;
}

Assistant:

Variable::Variable(Enums::Kind kind, std::string type, int value, int tag) {
    this->kind = kind;
    this->name = "literal_" + std::to_string(tag);
    this->visibility = Enums::Visibility::PRIVATE;
    this->type = std::move(type);
    this->value = value;
    this->dimensions = 0;
    this->offset = 0;
    this->size = 0;
}